

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::GLMRegressor_DoubleArray::SerializeWithCachedSizes
          (GLMRegressor_DoubleArray *this,CodedOutputStream *output)

{
  Rep *pRVar1;
  double *a;
  
  if (0 < (this->value_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_value_cached_byte_size_);
    pRVar1 = (this->value_).rep_;
    a = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      a = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (a,(this->value_).current_size_,output);
    return;
  }
  return;
}

Assistant:

void GLMRegressor_DoubleArray::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.GLMRegressor.DoubleArray)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated double value = 1;
  if (this->value_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_value_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->value().data(), this->value_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.GLMRegressor.DoubleArray)
}